

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O1

void gen_xxbrw(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *ts_02;
  TCGTemp *ts_03;
  TCGTemp *ts_04;
  TCGv_i64 arg2;
  TCGv_i64 arg2_00;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  
  if (ctx->vsx_enabled != false) {
    s = ctx->uc->tcg_ctx;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = (TCGv_i64)((long)ts - (long)s);
    ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)ts_00 - (long)s);
    ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ts_02 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_01,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4) * 0x10 + 0x12b28)
                     );
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts_02,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0xb & 0x1f | (ctx->opcode & 2) << 4) * 0x10 + 0x12b20)
                     );
    ts_03 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    arg2 = (TCGv_i64)((long)ts_03 - (long)s);
    ts_04 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    arg2_00 = (TCGv_i64)((long)ts_04 - (long)s);
    tcg_gen_bswap64_i64_ppc64(s,arg2,(TCGv_i64)((long)ts_01 - (long)s));
    tcg_gen_bswap64_i64_ppc64(s,arg2_00,(TCGv_i64)((long)ts_02 - (long)s));
    tcg_gen_shri_i64_ppc64(s,ret,arg2,0x20);
    tcg_gen_deposit_i64_ppc64(s,ret,ret,arg2,0x20,0x20);
    tcg_gen_shri_i64_ppc64(s,ret_00,arg2_00,0x20);
    tcg_gen_deposit_i64_ppc64(s,ret_00,ret_00,arg2_00,0x20,0x20);
    tcg_temp_free_internal_ppc64(s,ts_03);
    tcg_temp_free_internal_ppc64(s,ts_04);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b28
                             ));
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts_00,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b20
                             ));
    tcg_temp_free_internal_ppc64(s,ts);
    tcg_temp_free_internal_ppc64(s,ts_00);
    tcg_temp_free_internal_ppc64(s,ts_01);
    tcg_temp_free_internal_ppc64(s,ts_02);
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xxbrw(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    TCGv_i64 xbh;
    TCGv_i64 xbl;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);
    xbh = tcg_temp_new_i64(tcg_ctx);
    xbl = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xbh, xB(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xbl, xB(ctx->opcode));

    gen_bswap32x4(tcg_ctx, xth, xtl, xbh, xbl);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), xtl);

    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
    tcg_temp_free_i64(tcg_ctx, xbh);
    tcg_temp_free_i64(tcg_ctx, xbl);
}